

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lines.cpp
# Opt level: O0

void just_test_test_case_f_test_split_lines_keeping_new_line(void)

{
  string_list_builder *psVar1;
  char (*s_) [1];
  char (*s__00) [4];
  char (*s__01) [8];
  char (*s__02) [9];
  char (*s__03) [9];
  char (*s__04) [8];
  char (*s__05) [9];
  char (*s__06) [9];
  char (*s__07) [9];
  char (*s__08) [11];
  char (*s__09) [11];
  char (*s__10) [9];
  char (*s__11) [10];
  char (*s__12) [10];
  char (*s__13) [10];
  char (*s__14) [10];
  char (*s__15) [2];
  char (*s__16) [2];
  char (*s__17) [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_10f0;
  allocator<char> local_10d1;
  string local_10d0;
  allocator<char> local_10a9;
  string local_10a8;
  string_list_builder local_1088;
  allocator<char> local_1069;
  string local_1068;
  assert_equal_container local_1048;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1020;
  allocator<char> local_1001;
  string local_1000;
  allocator<char> local_fd9;
  string local_fd8;
  string_list_builder local_fb8;
  allocator<char> local_f99;
  string local_f98;
  assert_equal_container local_f78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f50;
  allocator<char> local_f31;
  string local_f30;
  allocator<char> local_f09;
  string local_f08;
  string_list_builder local_ee8;
  allocator<char> local_ec9;
  string local_ec8;
  assert_equal_container local_ea8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e80;
  allocator<char> local_e61;
  string local_e60;
  allocator<char> local_e39;
  string local_e38;
  allocator<char> local_e11;
  string local_e10;
  string_list_builder local_df0;
  allocator<char> local_dd1;
  string local_dd0;
  assert_equal_container local_db0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d88;
  allocator<char> local_d69;
  string local_d68;
  allocator<char> local_d41;
  string local_d40;
  allocator<char> local_d19;
  string local_d18;
  string_list_builder local_cf8;
  allocator<char> local_cd9;
  string local_cd8;
  assert_equal_container local_cb8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c90;
  allocator<char> local_c71;
  string local_c70;
  allocator<char> local_c49;
  string local_c48;
  allocator<char> local_c21;
  string local_c20;
  string_list_builder local_c00;
  allocator<char> local_be1;
  string local_be0;
  assert_equal_container local_bc0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b98;
  allocator<char> local_b79;
  string local_b78;
  allocator<char> local_b51;
  string local_b50;
  allocator<char> local_b29;
  string local_b28;
  string_list_builder local_b08;
  allocator<char> local_ae9;
  string local_ae8;
  assert_equal_container local_ac8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_aa0;
  allocator<char> local_a81;
  string local_a80;
  allocator<char> local_a59;
  string local_a58;
  allocator<char> local_a31;
  string local_a30;
  string_list_builder local_a10;
  allocator<char> local_9f1;
  string local_9f0;
  assert_equal_container local_9d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9a8;
  allocator<char> local_989;
  string local_988;
  allocator<char> local_961;
  string local_960;
  allocator<char> local_939;
  string local_938;
  string_list_builder local_918;
  allocator<char> local_8f9;
  string local_8f8;
  assert_equal_container local_8d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8b0;
  allocator<char> local_891;
  string local_890;
  allocator<char> local_869;
  string local_868;
  allocator<char> local_841;
  string local_840;
  string_list_builder local_820;
  allocator<char> local_801;
  string local_800;
  assert_equal_container local_7e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7b8;
  allocator<char> local_799;
  string local_798;
  allocator<char> local_771;
  string local_770;
  string_list_builder local_750;
  allocator<char> local_731;
  string local_730;
  assert_equal_container local_710;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6e8;
  allocator<char> local_6c9;
  string local_6c8;
  allocator<char> local_6a1;
  string local_6a0;
  allocator<char> local_679;
  string local_678;
  string_list_builder local_658;
  allocator<char> local_639;
  string local_638;
  assert_equal_container local_618;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5f0;
  allocator<char> local_5d1;
  string local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  allocator<char> local_581;
  string local_580;
  string_list_builder local_560;
  allocator<char> local_541;
  string local_540;
  assert_equal_container local_520;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4f8;
  allocator<char> local_4d9;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  string_list_builder local_490;
  allocator<char> local_471;
  string local_470;
  assert_equal_container local_450;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_428;
  allocator<char> local_409;
  string local_408;
  allocator<char> local_3e1;
  string local_3e0;
  allocator<char> local_3b9;
  string local_3b8;
  string_list_builder local_398;
  allocator<char> local_379;
  string local_378;
  assert_equal_container local_358;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_330;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  string_list_builder local_2a0;
  allocator<char> local_281;
  string local_280;
  assert_equal_container local_260;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  string_list_builder local_1d0;
  allocator<char> local_1b1;
  string local_1b0;
  assert_equal_container local_190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  allocator<char> local_149;
  string local_148;
  string_list_builder local_128;
  allocator<char> local_109;
  string local_108;
  assert_equal_container local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  allocator<char> local_a1;
  string local_a0;
  string_list_builder local_80;
  allocator<char> local_51;
  string local_50;
  assert_equal_container local_30;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_51);
  just::test::assert_equal_container::assert_equal_container(&local_30,&local_50,0xca);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a1);
  anon_unknown.dwarf_b02d::string_list_builder::string_list_builder(&local_80,&local_a0);
  (anonymous_namespace)::split_lines<true,1>(&local_c0,(_anonymous_namespace_ *)0x1331c9,s_);
  just::test::assert_equal_container::operator()(&local_30,&local_80,&local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0);
  anon_unknown.dwarf_b02d::string_list_builder::~string_list_builder(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  just::test::assert_equal_container::~assert_equal_container(&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_109);
  just::test::assert_equal_container::assert_equal_container(&local_e8,&local_108,0xcb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"foo",&local_149);
  anon_unknown.dwarf_b02d::string_list_builder::string_list_builder(&local_128,&local_148);
  (anonymous_namespace)::split_lines<true,4>(&local_168,(_anonymous_namespace_ *)"foo",s__00);
  just::test::assert_equal_container::operator()(&local_e8,&local_128,&local_168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_168);
  anon_unknown.dwarf_b02d::string_list_builder::~string_list_builder(&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  just::test::assert_equal_container::~assert_equal_container(&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_1b1);
  just::test::assert_equal_container::assert_equal_container(&local_190,&local_1b0,0xcd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"foo\n",&local_1f1);
  anon_unknown.dwarf_b02d::string_list_builder::string_list_builder(&local_1d0,&local_1f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"bar",&local_219);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(&local_1d0,&local_218);
  (anonymous_namespace)::split_lines<true,8>(&local_238,(_anonymous_namespace_ *)"foo\nbar",s__01);
  just::test::assert_equal_container::operator()(&local_190,psVar1,&local_238);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  anon_unknown.dwarf_b02d::string_list_builder::~string_list_builder(&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  just::test::assert_equal_container::~assert_equal_container(&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_281);
  just::test::assert_equal_container::assert_equal_container(&local_260,&local_280,0xce);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"foo\n",&local_2c1);
  anon_unknown.dwarf_b02d::string_list_builder::string_list_builder(&local_2a0,&local_2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"\n",&local_2e9);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(&local_2a0,&local_2e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"bar",&local_311);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(psVar1,&local_310);
  (anonymous_namespace)::split_lines<true,9>(&local_330,(_anonymous_namespace_ *)"foo\n\nbar",s__02)
  ;
  just::test::assert_equal_container::operator()(&local_260,psVar1,&local_330);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  anon_unknown.dwarf_b02d::string_list_builder::~string_list_builder(&local_2a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  just::test::assert_equal_container::~assert_equal_container(&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_379);
  just::test::assert_equal_container::assert_equal_container(&local_358,&local_378,0xd2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"foo\n",&local_3b9);
  anon_unknown.dwarf_b02d::string_list_builder::string_list_builder(&local_398,&local_3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"bar\n",&local_3e1);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(&local_398,&local_3e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"",&local_409);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(psVar1,&local_408);
  (anonymous_namespace)::split_lines<true,9>(&local_428,(_anonymous_namespace_ *)"foo\nbar\n",s__03)
  ;
  just::test::assert_equal_container::operator()(&local_358,psVar1,&local_428);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_428);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  anon_unknown.dwarf_b02d::string_list_builder::~string_list_builder(&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  just::test::assert_equal_container::~assert_equal_container(&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_471);
  just::test::assert_equal_container::assert_equal_container(&local_450,&local_470,0xd7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,"foo\r",&local_4b1);
  anon_unknown.dwarf_b02d::string_list_builder::string_list_builder(&local_490,&local_4b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,"bar",&local_4d9);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(&local_490,&local_4d8);
  (anonymous_namespace)::split_lines<true,8>(&local_4f8,(_anonymous_namespace_ *)"foo\rbar",s__04);
  just::test::assert_equal_container::operator()(&local_450,psVar1,&local_4f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4f8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  anon_unknown.dwarf_b02d::string_list_builder::~string_list_builder(&local_490);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  just::test::assert_equal_container::~assert_equal_container(&local_450);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator(&local_471);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_540,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_541);
  just::test::assert_equal_container::assert_equal_container(&local_520,&local_540,0xdb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_580,"foo\r",&local_581);
  anon_unknown.dwarf_b02d::string_list_builder::string_list_builder(&local_560,&local_580);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"\r",&local_5a9);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(&local_560,&local_5a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d0,"bar",&local_5d1);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(psVar1,&local_5d0);
  (anonymous_namespace)::split_lines<true,9>(&local_5f0,(_anonymous_namespace_ *)"foo\r\rbar",s__05)
  ;
  just::test::assert_equal_container::operator()(&local_520,psVar1,&local_5f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5f0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  anon_unknown.dwarf_b02d::string_list_builder::~string_list_builder(&local_560);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator(&local_581);
  just::test::assert_equal_container::~assert_equal_container(&local_520);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator(&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_638,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_639);
  just::test::assert_equal_container::assert_equal_container(&local_618,&local_638,0xdf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_678,"foo\r",&local_679);
  anon_unknown.dwarf_b02d::string_list_builder::string_list_builder(&local_658,&local_678);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a0,"bar\r",&local_6a1);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(&local_658,&local_6a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c8,"",&local_6c9);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(psVar1,&local_6c8);
  (anonymous_namespace)::split_lines<true,9>(&local_6e8,(_anonymous_namespace_ *)"foo\rbar\r",s__06)
  ;
  just::test::assert_equal_container::operator()(&local_618,psVar1,&local_6e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6e8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::allocator<char>::~allocator(&local_6c9);
  std::__cxx11::string::~string((string *)&local_6a0);
  std::allocator<char>::~allocator(&local_6a1);
  anon_unknown.dwarf_b02d::string_list_builder::~string_list_builder(&local_658);
  std::__cxx11::string::~string((string *)&local_678);
  std::allocator<char>::~allocator(&local_679);
  just::test::assert_equal_container::~assert_equal_container(&local_618);
  std::__cxx11::string::~string((string *)&local_638);
  std::allocator<char>::~allocator(&local_639);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_730,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_731);
  just::test::assert_equal_container::assert_equal_container(&local_710,&local_730,0xe4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_770,"foo\r\n",&local_771);
  anon_unknown.dwarf_b02d::string_list_builder::string_list_builder(&local_750,&local_770);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_798,"bar",&local_799);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(&local_750,&local_798);
  (anonymous_namespace)::split_lines<true,9>(&local_7b8,(_anonymous_namespace_ *)"foo\r\nbar",s__07)
  ;
  just::test::assert_equal_container::operator()(&local_710,psVar1,&local_7b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_7b8);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator(&local_799);
  anon_unknown.dwarf_b02d::string_list_builder::~string_list_builder(&local_750);
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator(&local_771);
  just::test::assert_equal_container::~assert_equal_container(&local_710);
  std::__cxx11::string::~string((string *)&local_730);
  std::allocator<char>::~allocator(&local_731);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_800,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_801);
  just::test::assert_equal_container::assert_equal_container(&local_7e0,&local_800,0xe8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_840,"foo\r\n",&local_841);
  anon_unknown.dwarf_b02d::string_list_builder::string_list_builder(&local_820,&local_840);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_868,"\r\n",&local_869);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(&local_820,&local_868);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_890,"bar",&local_891);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(psVar1,&local_890);
  (anonymous_namespace)::split_lines<true,11>
            (&local_8b0,(_anonymous_namespace_ *)"foo\r\n\r\nbar",s__08);
  just::test::assert_equal_container::operator()(&local_7e0,psVar1,&local_8b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_8b0);
  std::__cxx11::string::~string((string *)&local_890);
  std::allocator<char>::~allocator(&local_891);
  std::__cxx11::string::~string((string *)&local_868);
  std::allocator<char>::~allocator(&local_869);
  anon_unknown.dwarf_b02d::string_list_builder::~string_list_builder(&local_820);
  std::__cxx11::string::~string((string *)&local_840);
  std::allocator<char>::~allocator(&local_841);
  just::test::assert_equal_container::~assert_equal_container(&local_7e0);
  std::__cxx11::string::~string((string *)&local_800);
  std::allocator<char>::~allocator(&local_801);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8f8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_8f9);
  just::test::assert_equal_container::assert_equal_container(&local_8d8,&local_8f8,0xec);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_938,"foo\r\n",&local_939);
  anon_unknown.dwarf_b02d::string_list_builder::string_list_builder(&local_918,&local_938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_960,"bar\r\n",&local_961);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(&local_918,&local_960);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_988,"",&local_989);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(psVar1,&local_988);
  (anonymous_namespace)::split_lines<true,11>
            (&local_9a8,(_anonymous_namespace_ *)"foo\r\nbar\r\n",s__09);
  just::test::assert_equal_container::operator()(&local_8d8,psVar1,&local_9a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_9a8);
  std::__cxx11::string::~string((string *)&local_988);
  std::allocator<char>::~allocator(&local_989);
  std::__cxx11::string::~string((string *)&local_960);
  std::allocator<char>::~allocator(&local_961);
  anon_unknown.dwarf_b02d::string_list_builder::~string_list_builder(&local_918);
  std::__cxx11::string::~string((string *)&local_938);
  std::allocator<char>::~allocator(&local_939);
  just::test::assert_equal_container::~assert_equal_container(&local_8d8);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::allocator<char>::~allocator(&local_8f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9f0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_9f1);
  just::test::assert_equal_container::assert_equal_container(&local_9d0,&local_9f0,0xf1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a30,"foo\n",&local_a31);
  anon_unknown.dwarf_b02d::string_list_builder::string_list_builder(&local_a10,&local_a30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a58,"\r",&local_a59);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(&local_a10,&local_a58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a80,"bar",&local_a81);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(psVar1,&local_a80);
  (anonymous_namespace)::split_lines<true,9>(&local_aa0,(_anonymous_namespace_ *)"foo\n\rbar",s__10)
  ;
  just::test::assert_equal_container::operator()(&local_9d0,psVar1,&local_aa0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_aa0);
  std::__cxx11::string::~string((string *)&local_a80);
  std::allocator<char>::~allocator(&local_a81);
  std::__cxx11::string::~string((string *)&local_a58);
  std::allocator<char>::~allocator(&local_a59);
  anon_unknown.dwarf_b02d::string_list_builder::~string_list_builder(&local_a10);
  std::__cxx11::string::~string((string *)&local_a30);
  std::allocator<char>::~allocator(&local_a31);
  just::test::assert_equal_container::~assert_equal_container(&local_9d0);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::allocator<char>::~allocator(&local_9f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ae8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_ae9);
  just::test::assert_equal_container::assert_equal_container(&local_ac8,&local_ae8,0xf5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b28,"foo\n",&local_b29);
  anon_unknown.dwarf_b02d::string_list_builder::string_list_builder(&local_b08,&local_b28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b50,"\r\n",&local_b51);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(&local_b08,&local_b50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b78,"bar",&local_b79);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(psVar1,&local_b78);
  (anonymous_namespace)::split_lines<true,10>
            (&local_b98,(_anonymous_namespace_ *)"foo\n\r\nbar",s__11);
  just::test::assert_equal_container::operator()(&local_ac8,psVar1,&local_b98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b98);
  std::__cxx11::string::~string((string *)&local_b78);
  std::allocator<char>::~allocator(&local_b79);
  std::__cxx11::string::~string((string *)&local_b50);
  std::allocator<char>::~allocator(&local_b51);
  anon_unknown.dwarf_b02d::string_list_builder::~string_list_builder(&local_b08);
  std::__cxx11::string::~string((string *)&local_b28);
  std::allocator<char>::~allocator(&local_b29);
  just::test::assert_equal_container::~assert_equal_container(&local_ac8);
  std::__cxx11::string::~string((string *)&local_ae8);
  std::allocator<char>::~allocator(&local_ae9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_be0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_be1);
  just::test::assert_equal_container::assert_equal_container(&local_bc0,&local_be0,0xf9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c20,"foo\r",&local_c21);
  anon_unknown.dwarf_b02d::string_list_builder::string_list_builder(&local_c00,&local_c20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c48,"\r\n",&local_c49);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(&local_c00,&local_c48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c70,"bar",&local_c71);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(psVar1,&local_c70);
  (anonymous_namespace)::split_lines<true,10>
            (&local_c90,(_anonymous_namespace_ *)"foo\r\r\nbar",s__12);
  just::test::assert_equal_container::operator()(&local_bc0,psVar1,&local_c90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c90);
  std::__cxx11::string::~string((string *)&local_c70);
  std::allocator<char>::~allocator(&local_c71);
  std::__cxx11::string::~string((string *)&local_c48);
  std::allocator<char>::~allocator(&local_c49);
  anon_unknown.dwarf_b02d::string_list_builder::~string_list_builder(&local_c00);
  std::__cxx11::string::~string((string *)&local_c20);
  std::allocator<char>::~allocator(&local_c21);
  just::test::assert_equal_container::~assert_equal_container(&local_bc0);
  std::__cxx11::string::~string((string *)&local_be0);
  std::allocator<char>::~allocator(&local_be1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_cd8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_cd9);
  just::test::assert_equal_container::assert_equal_container(&local_cb8,&local_cd8,0xfd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d18,"foo\r\n",&local_d19);
  anon_unknown.dwarf_b02d::string_list_builder::string_list_builder(&local_cf8,&local_d18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d40,"\r",&local_d41);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(&local_cf8,&local_d40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d68,"bar",&local_d69);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(psVar1,&local_d68);
  (anonymous_namespace)::split_lines<true,10>
            (&local_d88,(_anonymous_namespace_ *)"foo\r\n\rbar",s__13);
  just::test::assert_equal_container::operator()(&local_cb8,psVar1,&local_d88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d88);
  std::__cxx11::string::~string((string *)&local_d68);
  std::allocator<char>::~allocator(&local_d69);
  std::__cxx11::string::~string((string *)&local_d40);
  std::allocator<char>::~allocator(&local_d41);
  anon_unknown.dwarf_b02d::string_list_builder::~string_list_builder(&local_cf8);
  std::__cxx11::string::~string((string *)&local_d18);
  std::allocator<char>::~allocator(&local_d19);
  just::test::assert_equal_container::~assert_equal_container(&local_cb8);
  std::__cxx11::string::~string((string *)&local_cd8);
  std::allocator<char>::~allocator(&local_cd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_dd0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_dd1);
  just::test::assert_equal_container::assert_equal_container(&local_db0,&local_dd0,0x101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e10,"foo\r\n",&local_e11);
  anon_unknown.dwarf_b02d::string_list_builder::string_list_builder(&local_df0,&local_e10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e38,"\n",&local_e39);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(&local_df0,&local_e38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e60,"bar",&local_e61);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(psVar1,&local_e60);
  (anonymous_namespace)::split_lines<true,10>
            (&local_e80,(_anonymous_namespace_ *)"foo\r\n\nbar",s__14);
  just::test::assert_equal_container::operator()(&local_db0,psVar1,&local_e80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e80);
  std::__cxx11::string::~string((string *)&local_e60);
  std::allocator<char>::~allocator(&local_e61);
  std::__cxx11::string::~string((string *)&local_e38);
  std::allocator<char>::~allocator(&local_e39);
  anon_unknown.dwarf_b02d::string_list_builder::~string_list_builder(&local_df0);
  std::__cxx11::string::~string((string *)&local_e10);
  std::allocator<char>::~allocator(&local_e11);
  just::test::assert_equal_container::~assert_equal_container(&local_db0);
  std::__cxx11::string::~string((string *)&local_dd0);
  std::allocator<char>::~allocator(&local_dd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ec8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_ec9);
  just::test::assert_equal_container::assert_equal_container(&local_ea8,&local_ec8,0x106);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f08,"\n",&local_f09);
  anon_unknown.dwarf_b02d::string_list_builder::string_list_builder(&local_ee8,&local_f08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f30,"",&local_f31);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(&local_ee8,&local_f30);
  (anonymous_namespace)::split_lines<true,2>(&local_f50,(_anonymous_namespace_ *)0x1331c8,s__15);
  just::test::assert_equal_container::operator()(&local_ea8,psVar1,&local_f50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f50);
  std::__cxx11::string::~string((string *)&local_f30);
  std::allocator<char>::~allocator(&local_f31);
  anon_unknown.dwarf_b02d::string_list_builder::~string_list_builder(&local_ee8);
  std::__cxx11::string::~string((string *)&local_f08);
  std::allocator<char>::~allocator(&local_f09);
  just::test::assert_equal_container::~assert_equal_container(&local_ea8);
  std::__cxx11::string::~string((string *)&local_ec8);
  std::allocator<char>::~allocator(&local_ec9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f98,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_f99);
  just::test::assert_equal_container::assert_equal_container(&local_f78,&local_f98,0x107);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_fd8,"\r",&local_fd9);
  anon_unknown.dwarf_b02d::string_list_builder::string_list_builder(&local_fb8,&local_fd8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1000,"",&local_1001);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(&local_fb8,&local_1000);
  (anonymous_namespace)::split_lines<true,2>(&local_1020,(_anonymous_namespace_ *)0x1331c2,s__16);
  just::test::assert_equal_container::operator()(&local_f78,psVar1,&local_1020);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1020);
  std::__cxx11::string::~string((string *)&local_1000);
  std::allocator<char>::~allocator(&local_1001);
  anon_unknown.dwarf_b02d::string_list_builder::~string_list_builder(&local_fb8);
  std::__cxx11::string::~string((string *)&local_fd8);
  std::allocator<char>::~allocator(&local_fd9);
  just::test::assert_equal_container::~assert_equal_container(&local_f78);
  std::__cxx11::string::~string((string *)&local_f98);
  std::allocator<char>::~allocator(&local_f99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1068,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_1069);
  just::test::assert_equal_container::assert_equal_container(&local_1048,&local_1068,0x108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_10a8,"\r\n",&local_10a9);
  anon_unknown.dwarf_b02d::string_list_builder::string_list_builder(&local_1088,&local_10a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_10d0,"",&local_10d1);
  psVar1 = anon_unknown.dwarf_b02d::string_list_builder::operator()(&local_1088,&local_10d0);
  (anonymous_namespace)::split_lines<true,3>(&local_10f0,(_anonymous_namespace_ *)0x1331c7,s__17);
  just::test::assert_equal_container::operator()(&local_1048,psVar1,&local_10f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_10f0);
  std::__cxx11::string::~string((string *)&local_10d0);
  std::allocator<char>::~allocator(&local_10d1);
  anon_unknown.dwarf_b02d::string_list_builder::~string_list_builder(&local_1088);
  std::__cxx11::string::~string((string *)&local_10a8);
  std::allocator<char>::~allocator(&local_10a9);
  just::test::assert_equal_container::~assert_equal_container(&local_1048);
  std::__cxx11::string::~string((string *)&local_1068);
  std::allocator<char>::~allocator(&local_1069);
  return;
}

Assistant:

JUST_TEST_CASE(test_split_lines_keeping_new_line)
{
  typedef string_list_builder v;

  JUST_ASSERT_EQUAL_CONTAINER(v(""), split_lines<true>(""));
  JUST_ASSERT_EQUAL_CONTAINER(v("foo"), split_lines<true>("foo"));

  JUST_ASSERT_EQUAL_CONTAINER(v("foo\n")("bar"), split_lines<true>("foo\nbar"));
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\n")("\n")("bar"),
    split_lines<true>("foo\n\nbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\n")("bar\n")(""),
    split_lines<true>("foo\nbar\n")
  );

  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r")("bar"),
    split_lines<true>("foo\rbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r")("\r")("bar"),
    split_lines<true>("foo\r\rbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r")("bar\r")(""),
    split_lines<true>("foo\rbar\r")
  );

  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r\n")("bar"),
    split_lines<true>("foo\r\nbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r\n")("\r\n")("bar"),
    split_lines<true>("foo\r\n\r\nbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r\n")("bar\r\n")(""),
    split_lines<true>("foo\r\nbar\r\n")
  );

  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\n")("\r")("bar"),
    split_lines<true>("foo\n\rbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\n")("\r\n")("bar"),
    split_lines<true>("foo\n\r\nbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r")("\r\n")("bar"),
    split_lines<true>("foo\r\r\nbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r\n")("\r")("bar"),
    split_lines<true>("foo\r\n\rbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r\n")("\n")("bar"),
    split_lines<true>("foo\r\n\nbar")
  );

  JUST_ASSERT_EQUAL_CONTAINER(v("\n")(""), split_lines<true>("\n"));
  JUST_ASSERT_EQUAL_CONTAINER(v("\r")(""), split_lines<true>("\r"));
  JUST_ASSERT_EQUAL_CONTAINER(v("\r\n")(""), split_lines<true>("\r\n"));
}